

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

char16_t __thiscall chaiscript::Boxed_Number::get_as<char16_t>(Boxed_Number *this)

{
  char16_t cVar1;
  Common_Types CVar2;
  undefined8 *puVar3;
  
  CVar2 = get_common_type(&this->bv);
  switch(CVar2) {
  case t_int32:
  case t_uint16:
  case t_int16:
  case t_uint32:
  case t_uint64:
  case t_int64:
    cVar1 = *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_double:
    cVar1 = (char16_t)
            (int)*((this->bv).m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_const_data_ptr;
    break;
  case t_uint8:
    cVar1 = (char16_t)
            *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_int8:
    cVar1 = (char16_t)
            *((this->bv).m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_const_data_ptr;
    break;
  case t_float:
    cVar1 = (char16_t)
            (int)*((this->bv).m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->m_const_data_ptr;
    break;
  case t_long_double:
    cVar1 = (char16_t)
            (int)ROUND(*((this->bv).m_data.
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_const_data_ptr);
    break;
  default:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__bad_cast_003f7e20;
    __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  return cVar1;
}

Assistant:

Target get_as() const {
      switch (get_common_type(bv)) {
        case Common_Types::t_int32:
          return get_as_aux<Target, int32_t>(bv);
        case Common_Types::t_uint8:
          return get_as_aux<Target, uint8_t>(bv);
        case Common_Types::t_int8:
          return get_as_aux<Target, int8_t>(bv);
        case Common_Types::t_uint16:
          return get_as_aux<Target, uint16_t>(bv);
        case Common_Types::t_int16:
          return get_as_aux<Target, int16_t>(bv);
        case Common_Types::t_uint32:
          return get_as_aux<Target, uint32_t>(bv);
        case Common_Types::t_uint64:
          return get_as_aux<Target, uint64_t>(bv);
        case Common_Types::t_int64:
          return get_as_aux<Target, int64_t>(bv);
        case Common_Types::t_double:
          return get_as_aux<Target, double>(bv);
        case Common_Types::t_float:
          return get_as_aux<Target, float>(bv);
        case Common_Types::t_long_double:
          return get_as_aux<Target, long double>(bv);
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }